

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_interface.cpp
# Opt level: O2

void __thiscall cppcms::cache_interface::store_page(cache_interface *this,string *key,int timeout)

{
  base_cache *pbVar1;
  response *prVar2;
  time_t tVar3;
  char *__lhs;
  string r_key;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (((this->cache_module_).p_ != (base_cache *)0x0) && (this->context_ != (context *)0x0)) {
    prVar2 = http::context::response(this->context_);
    http::response::finalize(prVar2);
    __lhs = "_Z:";
    if ((this->field_0x78 & 1) == 0) {
      __lhs = "_U:";
    }
    std::operator+(&local_38,__lhs,key);
    add_trigger(this,key);
    pbVar1 = (this->cache_module_).p_;
    prVar2 = http::context::response(this->context_);
    http::response::copied_data_abi_cxx11_(&sStack_58,prVar2);
    tVar3 = anon_unknown_0::deadtime(timeout);
    (*pbVar1->_vptr_base_cache[1])(pbVar1,&local_38,&sStack_58,&this->triggers_,tVar3,0);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

bool cache_interface::nocache()
{
	return cache_module_.get()==0;
}